

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  TPZGeoTetrahedra::TypeName_abi_cxx11_();
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }